

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseDelphiCoverage::HTMLParser::initializeDelphiFile
          (HTMLParser *this,string *filename,FileLinesType *coverageVector)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  int local_288;
  uint local_284;
  ulong local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  beginSet;
  string line;
  ifstream in;
  uint auStack_218 [122];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  beginSet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  beginSet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  beginSet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&in,(filename->_M_dataplus)._M_p,_S_in);
  uVar7 = *(uint *)((long)auStack_218 + *(long *)(_in + -0x18));
  if ((uVar7 & 5) == 0) {
    local_280 = 0;
    local_284 = uVar7;
    while (bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&in,&line,(bool *)0x0,-1), bVar1
          ) {
      lVar2 = std::__cxx11::string::find((char *)&line,0x499527);
      cVar6 = (char)&line;
      lVar3 = std::__cxx11::string::find_first_not_of(cVar6,0x20);
      if ((lVar2 == -1) || (lVar2 != lVar3)) {
        lVar2 = std::__cxx11::string::find(cVar6,0x7b);
        if (lVar2 == -1) {
          lVar2 = std::__cxx11::string::find(cVar6,0x7d);
          if (lVar2 == -1) {
            lVar2 = std::__cxx11::string::find((char *)&line,0x49952d);
            if ((lVar2 == -1) ||
               (beginSet.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                beginSet.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00171fac;
            beginSet.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 beginSet.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            std::__cxx11::string::~string
                      ((string *)
                       beginSet.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            local_288 = -1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(coverageVector,&local_288);
          }
          else {
            local_288 = -1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(coverageVector,&local_288);
            local_280 = 0;
          }
        }
        else {
          local_280 = CONCAT71((int7)((ulong)lVar2 >> 8),1);
LAB_00171fac:
          bVar1 = false;
          uVar4 = std::__cxx11::string::find((char *)&line,0x5006a0);
          if (uVar4 != 0xffffffffffffffff) {
            uVar5 = std::__cxx11::string::find(cVar6,0x3b);
            bVar1 = uVar4 < uVar5;
          }
          if (((beginSet.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                beginSet.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) || (line._M_string_length == 0)) ||
             (bVar1 || (local_280 & 1) != 0)) {
            local_288 = -1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(coverageVector,&local_288);
            uVar7 = local_284;
          }
          else {
            local_288 = 0;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(coverageVector,&local_288);
            local_280 = 0;
            uVar7 = local_284;
          }
        }
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&beginSet,
                   (char (*) [6])"begin");
        local_288 = -1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(coverageVector,&local_288);
      }
    }
  }
  std::ifstream::~ifstream(&in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&beginSet);
  std::__cxx11::string::~string((string *)&line);
  return (uVar7 & 5) == 0;
}

Assistant:

bool initializeDelphiFile(
    std::string const& filename,
    cmParseDelphiCoverage::HTMLParser::FileLinesType& coverageVector)
  {
    std::string line;
    size_t comPos;
    size_t semiPos;
    bool blockComFlag = false;
    bool lineComFlag = false;
    std::vector<std::string> beginSet;
    cmsys::ifstream in(filename.c_str());
    if (!in) {
      return false;
    }
    while (cmSystemTools::GetLineFromStream(in, line)) {
      lineComFlag = false;
      // Unique cases found in lines.
      size_t beginPos = line.find("begin");

      // Check that the begin is the first non-space string on the line
      if ((beginPos == line.find_first_not_of(' ')) &&
          beginPos != std::string::npos) {
        beginSet.emplace_back("begin");
        coverageVector.push_back(-1);
        continue;
      }
      if (line.find('{') != std::string::npos) {
        blockComFlag = true;
      } else if (line.find('}') != std::string::npos) {
        blockComFlag = false;
        coverageVector.push_back(-1);
        continue;
      } else if ((line.find("end;") != std::string::npos) &&
                 !beginSet.empty()) {
        beginSet.pop_back();
        coverageVector.push_back(-1);
        continue;
      }

      //  This checks for comments after lines of code, finding the
      //  comment symbol after the ending semicolon.
      comPos = line.find("//");
      if (comPos != std::string::npos) {
        semiPos = line.find(';');
        if (comPos < semiPos) {
          lineComFlag = true;
        }
      }
      // Based up what was found, add a line to the coverageVector
      if (!beginSet.empty() && !line.empty() && !blockComFlag &&
          !lineComFlag) {
        coverageVector.push_back(0);
      } else {
        coverageVector.push_back(-1);
      }
    }
    return true;
  }